

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memrev.c
# Opt level: O0

int mpt_memswap(void *from,void *to,size_t len)

{
  ulong local_438;
  size_t i;
  size_t parts;
  char buf [1024];
  size_t len_local;
  void *to_local;
  void *from_local;
  
  if ((from == (void *)0x0) || (to == (void *)0x0)) {
    from_local._4_4_ = -1;
  }
  else {
    buf._1016_8_ = len & 0x3ff;
    len_local = (size_t)to;
    to_local = from;
    for (local_438 = 0; local_438 < len >> 10; local_438 = local_438 + 1) {
      memcpy(&parts,to_local,0x400);
      memcpy(to_local,(void *)len_local,0x400);
      memcpy((void *)len_local,&parts,0x400);
      to_local = (void *)((long)to_local + 0x400);
      len_local = len_local + 0x400;
    }
    if (buf._1016_8_ != 0) {
      memcpy(&parts,to_local,buf._1016_8_);
      memcpy(to_local,(void *)len_local,buf._1016_8_);
      memcpy((void *)len_local,&parts,buf._1016_8_);
    }
    from_local._4_4_ = 0;
  }
  return from_local._4_4_;
}

Assistant:

extern int mpt_memswap(void *from, void *to, size_t len)
{
	char buf[1024];
	size_t parts, i;
	
	if (!from || !to) {
		return MPT_ERROR(BadArgument);
	}
	
	parts = len / sizeof(buf);
	len   = len % sizeof(buf);
	
	for ( i = 0 ; i < parts ; i++ ) {
		(void) memcpy(buf, from, sizeof(buf));
		(void) memcpy(from, to, sizeof(buf));
		(void) memcpy(to, buf, sizeof(buf));
		
		from = ((char *) from) + sizeof(buf);
		to   = ((char *) to)   + sizeof(buf);
	}
	if ( len ) {
		(void) memcpy(buf, from, len);
		(void) memcpy(from, to, len);
		(void) memcpy(to, buf, len);
	}
	return 0;
}